

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O2

int __thiscall Ym_Emu<Ym2612_Emu>::run_until(Ym_Emu<Ym2612_Emu> *this,int time)

{
  int iVar1;
  sample_t_conflict1 *out;
  int iVar2;
  int pair_count;
  
  iVar1 = this->last_time;
  iVar2 = 1;
  pair_count = time - iVar1;
  if (pair_count != 0 && iVar1 <= time) {
    if (iVar1 < 0) {
      iVar2 = 0;
    }
    else {
      this->last_time = time;
      out = this->out;
      this->out = out + (uint)(pair_count * 2);
      Ym2612_Emu::run(&this->super_Ym2612_Emu,pair_count,out);
    }
  }
  return iVar2;
}

Assistant:

inline int Ym_Emu<Emu>::run_until( int time )
{
	int count = time - last_time;
	if ( count > 0 )
	{
		if ( last_time < 0 )
			return false;
		last_time = time;
		short* p = out;
		out += count * Emu::out_chan_count;
		Emu::run( count, p );
	}
	return true;
}